

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-closesocket.c
# Opt level: O1

int run_test_poll_closesocket(void)

{
  fprintf(_stderr,"%s\n","Test only relevant on Windows");
  fflush(_stderr);
  return 7;
}

Assistant:

TEST_IMPL(poll_closesocket) {
#ifndef _WIN32
  RETURN_SKIP("Test only relevant on Windows");
#else
  struct WSAData wsa_data;
  int r;
  unsigned long on;
  struct sockaddr_in addr;

  r = WSAStartup(MAKEWORD(2, 2), &wsa_data);
  ASSERT_OK(r);

  sock = socket(AF_INET, SOCK_STREAM, 0);
  ASSERT_NE(sock, INVALID_SOCKET);
  on = 1;
  r = ioctlsocket(sock, FIONBIO, &on);
  ASSERT_OK(r);

  r = uv_ip4_addr("127.0.0.1", TEST_PORT, &addr);
  ASSERT_OK(r);

  r = connect(sock, (const struct sockaddr*) &addr, sizeof addr);
  ASSERT(r);
  ASSERT_EQ(WSAGetLastError(), WSAEWOULDBLOCK);

  r = uv_poll_init(uv_default_loop(), &handle, sock);
  ASSERT_OK(r);
  r = uv_poll_start(&handle, UV_WRITABLE, poll_cb);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#endif
}